

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O3

cpputest_ulonglong __thiscall MockNamedValue::getUnsignedLongLongIntValue(MockNamedValue *this)

{
  SimpleString *left;
  int iVar1;
  long lVar2;
  bool bVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  SimpleString local_30;
  
  left = &this->type_;
  SimpleString::SimpleString(&local_30,"unsigned int");
  bVar3 = operator==(left,&local_30);
  SimpleString::~SimpleString(&local_30);
  if (bVar3) {
    return (ulong)(this->value_).unsignedIntValue_;
  }
  SimpleString::SimpleString(&local_30,"int");
  bVar3 = operator==(left,&local_30);
  if (bVar3) {
    iVar1 = (this->value_).intValue_;
    SimpleString::~SimpleString(&local_30);
    if (-1 < iVar1) {
      return (long)(this->value_).intValue_;
    }
  }
  else {
    SimpleString::~SimpleString(&local_30);
  }
  SimpleString::SimpleString(&local_30,"long int");
  bVar3 = operator==(left,&local_30);
  if (bVar3) {
    lVar2 = (this->value_).longIntValue_;
    SimpleString::~SimpleString(&local_30);
    if (-1 < lVar2) goto LAB_00127469;
  }
  else {
    SimpleString::~SimpleString(&local_30);
  }
  SimpleString::SimpleString(&local_30,"unsigned long int");
  bVar3 = operator==(left,&local_30);
  SimpleString::~SimpleString(&local_30);
  if (!bVar3) {
    SimpleString::SimpleString(&local_30,"long long int");
    bVar3 = operator==(left,&local_30);
    if (bVar3) {
      lVar2 = (this->value_).longIntValue_;
      SimpleString::~SimpleString(&local_30);
      if (-1 < lVar2) goto LAB_00127469;
    }
    else {
      SimpleString::~SimpleString(&local_30);
    }
    pUVar4 = UtestShell::getCurrent();
    pcVar5 = SimpleString::asCharString(left);
    pTVar6 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[9])
              (pUVar4,"unsigned long long int",pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
               ,0x11a,pTVar6);
  }
LAB_00127469:
  return (this->value_).longIntValue_;
}

Assistant:

cpputest_ulonglong MockNamedValue::getUnsignedLongLongIntValue() const
{
    if(type_ == "unsigned int")
        return value_.unsignedIntValue_;
    else if(type_ == "int" && value_.intValue_ >= 0)
        return (unsigned long long int)value_.intValue_;
    else if(type_ == "long int" && value_.longIntValue_ >= 0)
        return (unsigned long long int)value_.longIntValue_;
    else if(type_ == "unsigned long int")
        return value_.unsignedLongIntValue_;
    else if(type_ == "long long int" && value_.longLongIntValue_ >= 0)
        return (unsigned long long int)value_.longLongIntValue_;
    else
    {
        STRCMP_EQUAL("unsigned long long int", type_.asCharString());
        return value_.unsignedLongLongIntValue_;
    }
}